

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli.cc
# Opt level: O3

void anon_unknown.dwarf_12bf9c::brotli_context::_compress
               (h2o_compress_context_t *self,h2o_iovec_t *inbufs,size_t inbufcnt,
               h2o_send_state_t state,h2o_iovec_t **outbufs,size_t *outbufcnt)

{
  h2o_iovec_t *phVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  BrotliCompressor *pBVar5;
  uint uVar6;
  size_t *psVar7;
  ulong input_size;
  size_t sVar8;
  size_t sVar9;
  
  if (self[1].name.base == (char *)0x0) {
    if (state != H2O_SEND_STATE_IN_PROGRESS) {
      if (inbufcnt == 0) {
        uVar3 = 1;
      }
      else {
        psVar7 = &inbufs->len;
        uVar4 = 0;
        sVar8 = inbufcnt;
        do {
          uVar4 = uVar4 + *psVar7;
          psVar7 = psVar7 + 2;
          sVar8 = sVar8 - 1;
        } while (sVar8 != 0);
        if (uVar4 == 0xffffffffffffffff) goto LAB_00187f18;
        lVar2 = 0x3f;
        if (uVar4 - 1 != 0) {
          for (; uVar4 - 1 >> lVar2 == 0; lVar2 = lVar2 + -1) {
          }
        }
        uVar3 = 1;
        if (1 < uVar4) {
          uVar3 = ((uint)lVar2 ^ 0xffffffc0) + 0x41;
        }
      }
      if ((int)uVar3 < *(int *)&self[1].transform) {
        uVar6 = 10;
        if (10 < uVar3) {
          uVar6 = uVar3;
        }
        *(uint *)&self[1].transform = uVar6;
      }
    }
LAB_00187f18:
    pBVar5 = (BrotliCompressor *)operator_new(0x1448);
    brotli::BrotliCompressor::BrotliCompressor(pBVar5,*(BrotliParams *)&self[1].name.len);
    self[1].name.base = (char *)pBVar5;
  }
  _clear_bufs((brotli_context *)self);
  if (inbufcnt == 0) {
    if (state == H2O_SEND_STATE_IN_PROGRESS) goto LAB_00188049;
    _emit((brotli_context *)self,true,false);
  }
  else {
    uVar4 = 1L << (self[1].name.base[0xc] & 0x3fU);
    sVar8 = 0;
    sVar9 = 0;
    do {
      input_size = inbufs[sVar9].len - sVar8;
      if (uVar4 <= input_size) {
        input_size = uVar4;
      }
      brotli::BrotliCompressor::CopyInputToRingBuffer
                ((BrotliCompressor *)self[1].name.base,input_size,
                 (uint8_t *)(inbufs[sVar9].base + sVar8));
      sVar8 = input_size + sVar8;
      if (inbufs[sVar9].len == sVar8) {
        sVar9 = sVar9 + 1;
        if (sVar9 == inbufcnt) break;
        sVar8 = 0;
      }
    } while (sVar9 != inbufcnt);
    _emit((brotli_context *)self,state != H2O_SEND_STATE_IN_PROGRESS,
          state == H2O_SEND_STATE_IN_PROGRESS);
    if (state == H2O_SEND_STATE_IN_PROGRESS) goto LAB_00188049;
  }
  pBVar5 = (BrotliCompressor *)self[1].name.base;
  if (pBVar5 != (BrotliCompressor *)0x0) {
    brotli::BrotliCompressor::~BrotliCompressor(pBVar5);
  }
  operator_delete(pBVar5,0x1448);
  self[1].name.base = (char *)0x0;
LAB_00188049:
  phVar1 = (h2o_iovec_t *)self[2].name.len;
  *outbufs = phVar1;
  *outbufcnt = (long)self[2].transform - (long)phVar1 >> 4;
  return;
}

Assistant:

static void _compress(h2o_compress_context_t *self, h2o_iovec_t *inbufs, size_t inbufcnt, h2o_send_state_t state,
                              h2o_iovec_t **outbufs, size_t *outbufcnt) {
            static_cast<brotli_context*>(self)->_compress(inbufs, inbufcnt, !h2o_send_state_is_in_progress(state), outbufs, outbufcnt);
        }